

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O1

void * __thiscall ImportEntryWrapper::getPtr(ImportEntryWrapper *this)

{
  PEFile *pPVar1;
  int iVar2;
  IMAGE_DATA_DIRECTORY *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  
  pPVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE;
  if (pPVar1 != (PEFile *)0x0) {
    pIVar3 = PEFile::getDataDirectory(pPVar1);
    if ((pIVar3 != (IMAGE_DATA_DIRECTORY *)0x0) && ((ulong)pIVar3[1].VirtualAddress != 0)) {
      pPVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE;
      iVar2 = (*(pPVar1->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0x18])(pPVar1,(ulong)pIVar3[1].VirtualAddress,2,0);
      lVar4 = CONCAT44(extraout_var,iVar2);
      if (lVar4 != -1) {
        pPVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE;
        iVar2 = (*(pPVar1->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0xe])(pPVar1,lVar4,1,0x14,0);
        if (CONCAT44(extraout_var_00,iVar2) != 0) {
          pPVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE;
          iVar2 = (*(pPVar1->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                    _vptr_AbstractByteBuffer[0xe])
                            (pPVar1,lVar4 + (this->super_ImportBaseEntryWrapper).super_PENodeWrapper
                                            .super_ExeNodeWrapper.entryNum * 0x14,1,0x14,0);
          return (void *)CONCAT44(extraout_var_01,iVar2);
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* ImportEntryWrapper::getPtr()
{
    if (m_PE == NULL) return NULL;
    IMAGE_DATA_DIRECTORY *d = m_PE->getDataDirectory();
    if (!d) return NULL;
    
    offset_t importRva = static_cast<offset_t>(d[pe::DIR_IMPORT].VirtualAddress);
    if (importRva == 0) return NULL;

    offset_t descAddr = this->m_PE->toRaw(importRva, Executable::RVA);
    if (descAddr == INVALID_ADDR) {
        return NULL; // address invalid
    }
    BYTE *dirPtr = this->m_PE->getContentAt(descAddr, Executable::RAW, sizeof(IMAGE_IMPORT_DESCRIPTOR));
    if (dirPtr == NULL) return NULL; // address invalid

    offset_t entryOffset = descAddr + (this->entryNum * sizeof(IMAGE_IMPORT_DESCRIPTOR));

    BYTE *content = this->m_PE->getContentAt(entryOffset, Executable::RAW, sizeof(IMAGE_IMPORT_DESCRIPTOR));
    if (!content) return NULL;
    return (void*) content;
}